

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

void __thiscall
capnp::SchemaLoader::Validator::validate
          (Validator *this,Reader *type,Reader *value,uint *dataSizeInBits,bool *isPointer)

{
  bool bVar1;
  uint uVar2;
  ushort uVar3;
  uint uVar4;
  uint local_38;
  uint local_34;
  Fault f;
  
  validate(this,type);
  uVar3 = 0;
  if (0xf < (type->_reader).dataSize) {
    uVar3 = *(type->_reader).data;
  }
  if (uVar3 < 0x13) {
    local_38 = (uint)uVar3;
    bVar1 = (bool)(&DAT_001a2408)[uVar3];
    *dataSizeInBits = (&DAT_001a23bc)[uVar3];
    *isPointer = bVar1;
    uVar2 = (value->_reader).dataSize;
    uVar4 = 0;
    if (0xf < uVar2) {
      uVar4 = (uint)*(value->_reader).data;
    }
    if (local_38 != uVar4) {
      local_34 = 0;
      if (0xf < uVar2) {
        local_34 = (uint)*(value->_reader).data;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],unsigned_int,unsigned_int>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x1f1,FAILED,"value.which() == expectedValueType",
                 "\"Value did not match type.\", (uint)value.which(), (uint)expectedValueType",
                 (char (*) [26])"Value did not match type.",&local_34,&local_38);
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
    }
  }
  return;
}

Assistant:

void validate(const schema::Type::Reader& type, const schema::Value::Reader& value,
                uint* dataSizeInBits, bool* isPointer) {
    validate(type);

    schema::Value::Which expectedValueType = schema::Value::VOID;
    bool hadCase = false;
    switch (type.which()) {
#define HANDLE_TYPE(name, bits, ptr) \
      case schema::Type::name: \
        expectedValueType = schema::Value::name; \
        *dataSizeInBits = bits; *isPointer = ptr; \
        hadCase = true; \
        break;
      HANDLE_TYPE(VOID, 0, false)
      HANDLE_TYPE(BOOL, 1, false)
      HANDLE_TYPE(INT8, 8, false)
      HANDLE_TYPE(INT16, 16, false)
      HANDLE_TYPE(INT32, 32, false)
      HANDLE_TYPE(INT64, 64, false)
      HANDLE_TYPE(UINT8, 8, false)
      HANDLE_TYPE(UINT16, 16, false)
      HANDLE_TYPE(UINT32, 32, false)
      HANDLE_TYPE(UINT64, 64, false)
      HANDLE_TYPE(FLOAT32, 32, false)
      HANDLE_TYPE(FLOAT64, 64, false)
      HANDLE_TYPE(TEXT, 0, true)
      HANDLE_TYPE(DATA, 0, true)
      HANDLE_TYPE(LIST, 0, true)
      HANDLE_TYPE(ENUM, 16, false)
      HANDLE_TYPE(STRUCT, 0, true)
      HANDLE_TYPE(INTERFACE, 0, true)
      HANDLE_TYPE(ANY_POINTER, 0, true)
#undef HANDLE_TYPE
    }

    if (hadCase) {
      VALIDATE_SCHEMA(value.which() == expectedValueType, "Value did not match type.",
                      (uint)value.which(), (uint)expectedValueType);
    }
  }